

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<wchar_t>::basic_format
          (basic_format<wchar_t> *this,message_type *trans)

{
  formattible<wchar_t> *local_30;
  message_type *trans_local;
  basic_format<wchar_t> *this_local;
  
  basic_message<wchar_t>::basic_message(&this->message_,trans);
  std::__cxx11::wstring::wstring((wstring *)&this->format_);
  this->translate_ = true;
  local_30 = this->parameters_;
  do {
    details::formattible<wchar_t>::formattible(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (formattible<wchar_t> *)&this->parameters_count_);
  this->parameters_count_ = 0;
  std::
  vector<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ::vector(&this->ext_params_);
  return;
}

Assistant:

basic_format(message_type const &trans) : 
                message_(trans),
                translate_(true),
                parameters_count_(0)
            {
            }